

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

void connection_set_state(CONNECTION_HANDLE connection,CONNECTION_STATE connection_state)

{
  CONNECTION_STATE CVar1;
  ulong uStack_20;
  CONNECTION_STATE previous_state;
  uint64_t i;
  CONNECTION_STATE connection_state_local;
  CONNECTION_HANDLE connection_local;
  
  CVar1 = connection->connection_state;
  connection->connection_state = connection_state;
  if (connection->on_connection_state_changed != (ON_CONNECTION_STATE_CHANGED)0x0) {
    (*connection->on_connection_state_changed)
              (connection->on_connection_state_changed_callback_context,connection_state,CVar1);
  }
  for (uStack_20 = 0; uStack_20 < connection->endpoint_count; uStack_20 = uStack_20 + 1) {
    if (connection->endpoints[uStack_20]->on_connection_state_changed !=
        (ON_CONNECTION_STATE_CHANGED)0x0) {
      (*connection->endpoints[uStack_20]->on_connection_state_changed)
                (connection->endpoints[uStack_20]->callback_context,connection_state,CVar1);
    }
  }
  return;
}

Assistant:

static void connection_set_state(CONNECTION_HANDLE connection, CONNECTION_STATE connection_state)
{
    uint64_t i;

    CONNECTION_STATE previous_state = connection->connection_state;
    connection->connection_state = connection_state;

    /* Codes_S_R_S_CONNECTION_22_001: [If a connection state changed occurs and a callback is registered the callback shall be called.] */
    if (connection->on_connection_state_changed)
    {
        connection->on_connection_state_changed(connection->on_connection_state_changed_callback_context, connection_state, previous_state);
    }

    /* Codes_S_R_S_CONNECTION_01_260: [Each endpoint's on_connection_state_changed shall be called.] */
    for (i = 0; i < connection->endpoint_count; i++)
    {
        /* Codes_S_R_S_CONNECTION_01_259: [The callback_context passed in connection_create_endpoint.] */
        if (connection->endpoints[i]->on_connection_state_changed != NULL)
        {
            connection->endpoints[i]->on_connection_state_changed(connection->endpoints[i]->callback_context, connection_state, previous_state);
        }
    }
}